

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

CumSumLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_cumsum(NeuralNetworkLayer *this)

{
  bool bVar1;
  CumSumLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_cumsum(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_cumsum(this);
    this_00 = (CumSumLayerParams *)operator_new(0x20);
    CumSumLayerParams::CumSumLayerParams(this_00);
    (this->layer_).cumsum_ = this_00;
  }
  return (CumSumLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::CumSumLayerParams* NeuralNetworkLayer::mutable_cumsum() {
  if (!has_cumsum()) {
    clear_layer();
    set_has_cumsum();
    layer_.cumsum_ = new ::CoreML::Specification::CumSumLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.cumSum)
  return layer_.cumsum_;
}